

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O3

void read_inter_frame_mode_info(AV1Decoder *pbi,DecoderCodingBlock *dcb,aom_reader *r)

{
  int_mv *mv;
  AV1_COMMON *cm;
  uint8_t *puVar1;
  CANDIDATE_MV (*ref_mv_stack) [8];
  uint16_t (*ref_mv_weight) [8];
  nmv_context *pnVar2;
  aom_cdf_prob (*icdf) [9];
  BLOCK_SIZE BVar3;
  _Bool _Var4;
  ushort uVar5;
  MB_MODE_INFO *pMVar6;
  MB_MODE_INFO *pMVar7;
  MB_MODE_INFO *pMVar8;
  FRAME_CONTEXT *pFVar9;
  int iVar10;
  int_mv iVar11;
  int_mv iVar12;
  int8_t iVar13;
  MOTION_MODE MVar17;
  short sVar18;
  int m;
  MV MVar40;
  uint8_t uVar14;
  char cVar15;
  BLOCK_SIZE BVar16;
  short sVar19;
  short sVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int_mv iVar25;
  int_mv iVar26;
  uint uVar27;
  uint16_t *puVar28;
  SequenceHeader *pSVar29;
  byte bVar30;
  PREDICTION_MODE PVar31;
  byte bVar32;
  byte bVar33;
  ushort uVar34;
  ushort uVar35;
  uint uVar36;
  ulong uVar37;
  long lVar38;
  RefCntBuffer *pRVar39;
  ulong uVar41;
  RefCntBuffer *pRVar42;
  MV_REFERENCE_FRAME ref_frame;
  byte *pbVar43;
  undefined2 uVar44;
  MV MVar45;
  nmv_context *nmvc;
  MV MVar46;
  long lVar47;
  scale_factors *psVar48;
  aom_cdf_prob *paVar49;
  od_ec_dec *poVar50;
  FRAME_CONTEXT *pFVar51;
  MV MVar52;
  MV MVar53;
  aom_cdf_prob (*paaVar54) [3];
  aom_cdf_prob (*icdf_00) [6] [3];
  aom_cdf_prob (*icdf_01) [3] [3];
  aom_cdf_prob (*icdf_02) [2] [3];
  aom_cdf_prob (*paaVar55) [4];
  aom_cdf_prob (*icdf_03) [5];
  bool bVar56;
  undefined8 *puVar57;
  MACROBLOCKD *pMVar58;
  bool bVar59;
  bool bVar60;
  short local_25c;
  byte local_242;
  byte local_241;
  int_mv nearestmv [2];
  MV_REFERENCE_FRAME *local_238;
  int_mv nearmv [2];
  undefined1 local_200 [8];
  MACROBLOCKD *xd;
  nmv_component *local_1f0;
  nmv_component *local_1e8;
  AV1_COMMON *local_1e0;
  int16_t inter_mode_ctx [29];
  int pts_inref [16];
  int pts [16];
  int_mv ref_mvs [29] [2];
  
  cm = &pbi->common;
  pMVar6 = *(dcb->xd).mi;
  pMVar6->mv[0] = (int_mv)0x0;
  pMVar6->mv[1] = (int_mv)0x0;
  uVar21 = read_inter_segment_id(cm,&dcb->xd,1,r);
  uVar21 = uVar21 & 7;
  *(ushort *)&pMVar6->field_0xa7 = *(ushort *)&pMVar6->field_0xa7 & 0xfff8 | (ushort)uVar21;
  uVar22 = 0;
  if (((pbi->common).current_frame.skip_mode_info.skip_mode_flag != 0) &&
     ((uVar14 = (pbi->common).seg.enabled, uVar14 == '\0' ||
      (((pbi->common).seg.feature_mask[uVar21] & 0x40) == 0)))) {
    BVar3 = (*(dcb->xd).mi)->bsize;
    bVar30 = block_size_high[BVar3];
    if (block_size_wide[BVar3] < block_size_high[BVar3]) {
      bVar30 = block_size_wide[BVar3];
    }
    if ((7 < bVar30) &&
       ((uVar14 == '\0' || (uVar22 = 0, ((pbi->common).seg.feature_mask[uVar21] & 0xa0) == 0)))) {
      pMVar7 = (dcb->xd).left_mbmi;
      pMVar8 = (dcb->xd).above_mbmi;
      if (pMVar8 == (MB_MODE_INFO *)0x0) {
        uVar41 = 0;
      }
      else {
        uVar41 = (ulong)(*(ushort *)&pMVar8->field_0xa7 >> 6 & 1);
      }
      if (pMVar7 == (MB_MODE_INFO *)0x0) {
        uVar37 = 0;
      }
      else {
        uVar37 = (ulong)(*(ushort *)&pMVar7->field_0xa7 >> 6 & 1);
      }
      lVar38 = uVar37 + uVar41;
      pFVar9 = (dcb->xd).tile_ctx;
      paaVar54 = pFVar9->skip_mode_cdfs + lVar38;
      uVar22 = od_ec_decode_cdf_q15(&r->ec,*paaVar54,2);
      if (r->allow_update_cdf != '\0') {
        uVar34 = pFVar9->skip_mode_cdfs[lVar38][2];
        bVar30 = (char)(uVar34 >> 4) + 4;
        uVar35 = (*paaVar54)[0];
        if ((char)uVar22 < '\x01') {
          sVar20 = -(uVar35 >> (bVar30 & 0x1f));
        }
        else {
          sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
        }
        (*paaVar54)[0] = sVar20 + uVar35;
        pFVar9->skip_mode_cdfs[lVar38][2] = uVar34 + (uVar34 < 0x20);
      }
    }
  }
  uVar34 = *(ushort *)&pMVar6->field_0xa7;
  *(ushort *)&pMVar6->field_0xa7 = uVar34 & 0xffbf | (ushort)((uVar22 & 1) << 6);
  uVar14 = '\x01';
  if ((uVar22 & 1) == 0) {
    iVar23 = read_skip_txfm(cm,&dcb->xd,uVar34 & 7,r);
    uVar14 = (uint8_t)iVar23;
  }
  pMVar6->skip_txfm = uVar14;
  if ((pbi->common).seg.segid_preskip == '\0') {
    iVar23 = read_inter_segment_id(cm,&dcb->xd,0,r);
    *(ushort *)&pMVar6->field_0xa7 = *(ushort *)&pMVar6->field_0xa7 & 0xfff8 | (ushort)iVar23 & 7;
  }
  read_cdef(cm,r,&dcb->xd);
  read_delta_q_params(cm,&dcb->xd,r);
  if ((*(ushort *)&pMVar6->field_0xa7 & 0x40) == 0) {
    if ((pbi->common).seg.enabled == '\0') {
LAB_0018200d:
      iVar23 = av1_get_intra_inter_context(&dcb->xd);
      pFVar9 = (dcb->xd).tile_ctx;
      paaVar54 = pFVar9->intra_inter_cdf + iVar23;
      uVar21 = od_ec_decode_cdf_q15(&r->ec,*paaVar54,2);
      if (r->allow_update_cdf != '\0') {
        uVar34 = pFVar9->intra_inter_cdf[iVar23][2];
        bVar30 = (char)(uVar34 >> 4) + 4;
        uVar35 = (*paaVar54)[0];
        if ((char)uVar21 < '\x01') {
          sVar20 = -(uVar35 >> (bVar30 & 0x1f));
        }
        else {
          sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
        }
        (*paaVar54)[0] = sVar20 + uVar35;
        pFVar9->intra_inter_cdf[iVar23][2] = uVar34 + (uVar34 < 0x20);
      }
    }
    else {
      uVar21 = *(ushort *)&pMVar6->field_0xa7 & 7;
      uVar22 = (pbi->common).seg.feature_mask[uVar21];
      if ((uVar22 & 0x20) == 0) {
        uVar21 = 1;
        if (-1 < (char)uVar22) goto LAB_0018200d;
      }
      else {
        uVar21 = (uint)(0 < *(short *)((long)(pbi->common).seg.feature_data[0] +
                                      (ulong)(uVar21 << 4) + 10));
      }
    }
    bVar60 = uVar21 == 0;
  }
  else {
    bVar60 = false;
  }
  pMVar6->current_qindex = (dcb->xd).current_base_qindex;
  (dcb->xd).above_txfm_context =
       (pbi->common).above_contexts.txfm[(dcb->xd).tile.tile_row] + (dcb->xd).mi_col;
  (dcb->xd).left_txfm_context = (dcb->xd).left_txfm_context_buffer + ((dcb->xd).mi_row & 0x1f);
  BVar3 = pMVar6->bsize;
  if (bVar60) {
    pMVar6->ref_frame[0] = '\0';
    pMVar6->ref_frame[1] = -1;
    pFVar9 = (dcb->xd).tile_ctx;
    bVar30 = read_intra_mode(r,pFVar9->y_mode_cdf[""[BVar3]]);
    pMVar6->mode = bVar30;
    iVar13 = '\0';
    if ((BLOCK_8X4 < BVar3) && (iVar13 = '\0', 0xf7 < (byte)(bVar30 - 9))) {
      iVar23 = read_angle_delta(r,pFVar9->angle_delta_cdf[(ulong)bVar30 - 1]);
      iVar13 = (int8_t)iVar23;
    }
    pMVar6->angle_delta[0] = iVar13;
    uVar14 = ((pbi->common).seq_params)->monochrome;
    if ((uVar14 == '\0') && ((dcb->xd).is_chroma_ref == true)) {
      pMVar7 = *(dcb->xd).mi;
      uVar41 = (ulong)pMVar7->bsize;
      if ((dcb->xd).lossless[*(ushort *)&pMVar7->field_0xa7 & 7] == 0) {
        bVar60 = (0x2f0bffUL >> (uVar41 & 0x3f) & 1) != 0;
        if ((0x1f07ffUL >> (uVar41 & 0x3f) & 1) == 0) {
          bVar60 = false;
        }
      }
      else {
        bVar60 = av1_ss_size_lookup[uVar41][(dcb->xd).plane[1].subsampling_x]
                 [(dcb->xd).plane[1].subsampling_y] == BLOCK_4X4;
      }
      bVar30 = read_intra_mode_uv(pFVar9,r,bVar60,pMVar6->mode);
      pMVar6->uv_mode = bVar30;
      if (bVar30 == 0xd) {
        uVar14 = read_cfl_alphas((dcb->xd).tile_ctx,r,&pMVar6->cfl_alpha_signs);
        pMVar6->cfl_alpha_idx = uVar14;
        bVar30 = pMVar6->uv_mode;
      }
      iVar13 = '\0';
      if ((BLOCK_8X4 < BVar3) && (iVar13 = '\0', 0xf7 < (byte)(get_uv_mode_uv2y[bVar30] - 9))) {
        iVar23 = read_angle_delta(r,pFVar9->angle_delta_cdf
                                    [(ulong)(byte)get_uv_mode_uv2y[bVar30] - 1]);
        iVar13 = (int8_t)iVar23;
      }
      pMVar6->angle_delta[1] = iVar13;
      uVar14 = ((pbi->common).seq_params)->monochrome;
    }
    else {
      pMVar6->uv_mode = '\0';
    }
    if (uVar14 == '\0') {
      uVar22 = 1;
      if ((dcb->xd).is_chroma_ref != true) goto LAB_00182460;
      pMVar7 = *(dcb->xd).mi;
      if ((pMVar7->field_0xa7 & 0x80) == 0) {
        uVar22 = 0;
        if (pMVar7->ref_frame[0] < '\x01') {
          uVar22 = (uint)(pMVar7->uv_mode == '\r');
        }
        goto LAB_00182460;
      }
    }
    uVar22 = 0;
LAB_00182460:
    (dcb->xd).cfl.store_y = uVar22;
    (pMVar6->palette_mode_info).palette_size[0] = '\0';
    (pMVar6->palette_mode_info).palette_size[1] = '\0';
    if (((pbi->common).features.allow_screen_content_tools != false) &&
       ((BLOCK_128X128 < BVar3 || ((0xe007U >> (BVar3 & 0x1f) & 1) == 0)))) {
      read_palette_mode_info(cm,&dcb->xd,r);
    }
    read_filter_intra_mode_info(cm,&dcb->xd,r);
    return;
  }
  uVar22 = (uint)(pbi->common).features.allow_high_precision_mv;
  memset(ref_mvs,0,0xe8);
  pFVar9 = (dcb->xd).tile_ctx;
  pMVar6->uv_mode = '\0';
  (pMVar6->palette_mode_info).palette_size[0] = '\0';
  (pMVar6->palette_mode_info).palette_size[1] = '\0';
  (dcb->xd).neighbors_ref_counts[0] = '\0';
  (dcb->xd).neighbors_ref_counts[1] = '\0';
  (dcb->xd).neighbors_ref_counts[2] = '\0';
  (dcb->xd).neighbors_ref_counts[3] = '\0';
  (dcb->xd).neighbors_ref_counts[4] = '\0';
  (dcb->xd).neighbors_ref_counts[5] = '\0';
  (dcb->xd).neighbors_ref_counts[6] = '\0';
  (dcb->xd).neighbors_ref_counts[7] = '\0';
  _Var4 = (dcb->xd).left_available;
  if ((dcb->xd).up_available == true) {
    pMVar7 = (dcb->xd).above_mbmi;
    if ((pMVar7->field_0xa7 & 0x80) != 0 || '\0' < pMVar7->ref_frame[0]) {
      puVar1 = (dcb->xd).neighbors_ref_counts + pMVar7->ref_frame[0];
      *puVar1 = *puVar1 + '\x01';
      if (0 < (long)pMVar7->ref_frame[1]) {
        puVar1 = (dcb->xd).neighbors_ref_counts + pMVar7->ref_frame[1];
        *puVar1 = *puVar1 + '\x01';
      }
    }
  }
  if (_Var4 != false) {
    pMVar7 = (dcb->xd).left_mbmi;
    if ((pMVar7->field_0xa7 & 0x80) != 0 || '\0' < pMVar7->ref_frame[0]) {
      puVar1 = (dcb->xd).neighbors_ref_counts + pMVar7->ref_frame[0];
      *puVar1 = *puVar1 + '\x01';
      if (0 < (long)pMVar7->ref_frame[1]) {
        puVar1 = (dcb->xd).neighbors_ref_counts + pMVar7->ref_frame[1];
        *puVar1 = *puVar1 + '\x01';
      }
    }
  }
  pMVar7 = *(dcb->xd).mi;
  if ((pMVar7->field_0xa7 & 0x40) == 0) {
    if ((pbi->common).seg.enabled == '\0') {
LAB_00182301:
      BVar16 = pMVar7->bsize;
      bVar30 = block_size_high[BVar16];
      if (block_size_wide[BVar16] < block_size_high[BVar16]) {
        bVar30 = block_size_wide[BVar16];
      }
      if (7 < bVar30) {
        bVar30 = (pbi->common).current_frame.reference_mode;
        uVar21 = (uint)bVar30;
        if (bVar30 == 2) {
          iVar23 = av1_get_reference_mode_context(&dcb->xd);
          pFVar51 = (dcb->xd).tile_ctx;
          paaVar54 = pFVar51->comp_inter_cdf + iVar23;
          uVar21 = od_ec_decode_cdf_q15(&r->ec,*paaVar54,2);
          if (r->allow_update_cdf != '\0') {
            uVar34 = pFVar51->comp_inter_cdf[iVar23][2];
            bVar30 = (char)(uVar34 >> 4) + 4;
            uVar35 = (*paaVar54)[0];
            if ((char)uVar21 < '\x01') {
              sVar20 = -(uVar35 >> (bVar30 & 0x1f));
            }
            else {
              sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
            }
            (*paaVar54)[0] = sVar20 + uVar35;
            pFVar51->comp_inter_cdf[iVar23][2] = uVar34 + (uVar34 < 0x20);
          }
        }
        if ((char)uVar21 != '\0') {
          if ((uVar21 & 0xff) != 1) {
            ref_frame = pMVar6->ref_frame[0];
            bVar30 = pMVar6->ref_frame[1];
            goto LAB_001823d5;
          }
          iVar23 = av1_get_comp_reference_type_context(&dcb->xd);
          pFVar51 = (dcb->xd).tile_ctx;
          paaVar54 = pFVar51->comp_ref_type_cdf + iVar23;
          poVar50 = &r->ec;
          iVar24 = od_ec_decode_cdf_q15(poVar50,*paaVar54,2);
          if (r->allow_update_cdf != '\0') {
            uVar34 = pFVar51->comp_ref_type_cdf[iVar23][2];
            bVar30 = (char)(uVar34 >> 4) + 4;
            uVar35 = (*paaVar54)[0];
            if ((char)iVar24 < '\x01') {
              sVar20 = -(uVar35 >> (bVar30 & 0x1f));
            }
            else {
              sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
            }
            (*paaVar54)[0] = sVar20 + uVar35;
            pFVar51->comp_ref_type_cdf[iVar23][2] = uVar34 + (uVar34 < 0x20);
          }
          if ((char)iVar24 == '\0') {
            iVar23 = av1_get_pred_context_uni_comp_ref_p(&dcb->xd);
            iVar23 = aom_read_symbol_(r,(aom_cdf_prob *)
                                        (((dcb->xd).tile_ctx)->uni_comp_ref_cdf + iVar23),2);
            if (iVar23 != 0) {
              pMVar6->ref_frame[0] = '\x05';
              pMVar6->ref_frame[1] = '\a';
              goto LAB_00182b24;
            }
            iVar23 = av1_get_pred_context_uni_comp_ref_p1(&dcb->xd);
            iVar23 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->uni_comp_ref_cdf[iVar23][1],2);
            if (iVar23 == 0) {
              pMVar6->ref_frame[0] = '\x01';
              pMVar6->ref_frame[1] = '\x02';
              bVar30 = 2;
            }
            else {
              iVar23 = av1_get_pred_context_uni_comp_ref_p2(&dcb->xd);
              iVar23 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->uni_comp_ref_cdf[iVar23][2],2);
              pMVar6->ref_frame[0] = '\x01';
              if (iVar23 == 0) {
                pMVar6->ref_frame[1] = '\x03';
                bVar30 = 3;
              }
              else {
                pMVar6->ref_frame[1] = '\x04';
                bVar30 = 4;
              }
            }
          }
          else {
            iVar23 = av1_get_pred_context_comp_ref_p(&dcb->xd);
            pFVar51 = (dcb->xd).tile_ctx;
            icdf_01 = pFVar51->comp_ref_cdf + iVar23;
            iVar24 = od_ec_decode_cdf_q15(poVar50,(uint16_t *)icdf_01,2);
            if (r->allow_update_cdf != '\0') {
              uVar34 = pFVar51->comp_ref_cdf[iVar23][0][2];
              bVar30 = (char)(uVar34 >> 4) + 4;
              uVar35 = (*icdf_01)[0][0];
              if ((char)iVar24 < '\x01') {
                sVar20 = -(uVar35 >> (bVar30 & 0x1f));
              }
              else {
                sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
              }
              (*icdf_01)[0][0] = sVar20 + uVar35;
              pFVar51->comp_ref_cdf[iVar23][0][2] = uVar34 + (uVar34 < 0x20);
            }
            if (iVar24 == 0) {
              iVar23 = av1_get_pred_context_comp_ref_p1(&dcb->xd);
              iVar23 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->comp_ref_cdf[iVar23][1],2);
              cVar15 = '\x02';
            }
            else {
              iVar23 = av1_get_pred_context_comp_ref_p2(&dcb->xd);
              iVar23 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->comp_ref_cdf[iVar23][2],2);
              cVar15 = '\x04';
            }
            pMVar6->ref_frame[0] = cVar15 - (iVar23 == 0);
            iVar23 = av1_get_pred_context_comp_bwdref_p(&dcb->xd);
            pFVar51 = (dcb->xd).tile_ctx;
            icdf_02 = pFVar51->comp_bwdref_cdf + iVar23;
            iVar24 = od_ec_decode_cdf_q15(poVar50,(uint16_t *)icdf_02,2);
            if (r->allow_update_cdf != '\0') {
              uVar34 = pFVar51->comp_bwdref_cdf[iVar23][0][2];
              bVar30 = (char)(uVar34 >> 4) + 4;
              uVar35 = (*icdf_02)[0][0];
              if ((char)iVar24 < '\x01') {
                sVar20 = -(uVar35 >> (bVar30 & 0x1f));
              }
              else {
                sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
              }
              (*icdf_02)[0][0] = sVar20 + uVar35;
              pFVar51->comp_bwdref_cdf[iVar23][0][2] = uVar34 + (uVar34 < 0x20);
            }
            if (iVar24 == 0) {
              iVar23 = av1_get_pred_context_comp_bwdref_p1(&dcb->xd);
              iVar23 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->comp_bwdref_cdf[iVar23][1],2);
              bVar30 = 6 - (iVar23 == 0);
              pMVar6->ref_frame[1] = bVar30;
            }
            else {
              pMVar6->ref_frame[1] = '\a';
LAB_00182b24:
              bVar30 = 7;
            }
          }
          ref_frame = pMVar6->ref_frame[0];
          goto LAB_001823e6;
        }
      }
      pFVar51 = (dcb->xd).tile_ctx;
      iVar23 = av1_get_pred_context_single_ref_p1(&dcb->xd);
      icdf_00 = pFVar51->single_ref_cdf + iVar23;
      poVar50 = &r->ec;
      iVar24 = od_ec_decode_cdf_q15(poVar50,(uint16_t *)icdf_00,2);
      if (r->allow_update_cdf != '\0') {
        uVar34 = pFVar51->single_ref_cdf[iVar23][0][2];
        bVar30 = (char)(uVar34 >> 4) + 4;
        uVar35 = (*icdf_00)[0][0];
        if ((char)iVar24 < '\x01') {
          sVar20 = -(uVar35 >> (bVar30 & 0x1f));
        }
        else {
          sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
        }
        (*icdf_00)[0][0] = sVar20 + uVar35;
        pFVar51->single_ref_cdf[iVar23][0][2] = uVar34 + (uVar34 < 0x20);
      }
      pFVar51 = (dcb->xd).tile_ctx;
      if (iVar24 == 0) {
        iVar23 = av1_get_pred_context_single_ref_p3(&dcb->xd);
        paaVar54 = pFVar51->single_ref_cdf[iVar23] + 2;
        iVar24 = od_ec_decode_cdf_q15(poVar50,*paaVar54,2);
        if (r->allow_update_cdf != '\0') {
          uVar34 = pFVar51->single_ref_cdf[iVar23][2][2];
          bVar30 = (char)(uVar34 >> 4) + 4;
          uVar35 = (*paaVar54)[0];
          if ((char)iVar24 < '\x01') {
            sVar20 = -(uVar35 >> (bVar30 & 0x1f));
          }
          else {
            sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
          }
          (*paaVar54)[0] = sVar20 + uVar35;
          pFVar51->single_ref_cdf[iVar23][2][2] = uVar34 + (uVar34 < 0x20);
        }
        pFVar51 = (dcb->xd).tile_ctx;
        if (iVar24 == 0) {
          iVar23 = av1_get_pred_context_single_ref_p4(&dcb->xd);
          paaVar54 = pFVar51->single_ref_cdf[iVar23] + 3;
          iVar24 = od_ec_decode_cdf_q15(poVar50,*paaVar54,2);
          if (r->allow_update_cdf != '\0') {
            uVar34 = pFVar51->single_ref_cdf[iVar23][3][2];
            bVar30 = (char)(uVar34 >> 4) + 4;
            uVar35 = (*paaVar54)[0];
            if ((char)iVar24 < '\x01') {
              sVar20 = -(uVar35 >> (bVar30 & 0x1f));
            }
            else {
              sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
            }
            (*paaVar54)[0] = sVar20 + uVar35;
            pFVar51->single_ref_cdf[iVar23][3][2] = uVar34 + (uVar34 < 0x20);
          }
          cVar15 = '\x02';
        }
        else {
          iVar23 = av1_get_pred_context_single_ref_p5(&dcb->xd);
          paaVar54 = pFVar51->single_ref_cdf[iVar23] + 4;
          iVar24 = od_ec_decode_cdf_q15(poVar50,*paaVar54,2);
          if (r->allow_update_cdf != '\0') {
            uVar34 = pFVar51->single_ref_cdf[iVar23][4][2];
            bVar30 = (char)(uVar34 >> 4) + 4;
            uVar35 = (*paaVar54)[0];
            if ((char)iVar24 < '\x01') {
              sVar20 = -(uVar35 >> (bVar30 & 0x1f));
            }
            else {
              sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
            }
            (*paaVar54)[0] = sVar20 + uVar35;
            pFVar51->single_ref_cdf[iVar23][4][2] = uVar34 + (uVar34 < 0x20);
          }
          cVar15 = '\x04';
        }
        ref_frame = cVar15 - (iVar24 == 0);
      }
      else {
        iVar23 = av1_get_pred_context_single_ref_p2(&dcb->xd);
        paaVar54 = pFVar51->single_ref_cdf[iVar23] + 1;
        iVar24 = od_ec_decode_cdf_q15(poVar50,*paaVar54,2);
        if (r->allow_update_cdf != '\0') {
          uVar34 = pFVar51->single_ref_cdf[iVar23][1][2];
          bVar30 = (char)(uVar34 >> 4) + 4;
          uVar35 = (*paaVar54)[0];
          if ((char)iVar24 < '\x01') {
            sVar20 = -(uVar35 >> (bVar30 & 0x1f));
          }
          else {
            sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
          }
          (*paaVar54)[0] = sVar20 + uVar35;
          pFVar51->single_ref_cdf[iVar23][1][2] = uVar34 + (uVar34 < 0x20);
        }
        ref_frame = '\a';
        if (iVar24 == 0) {
          pFVar51 = (dcb->xd).tile_ctx;
          iVar23 = av1_get_pred_context_single_ref_p6(&dcb->xd);
          paaVar54 = pFVar51->single_ref_cdf[iVar23] + 5;
          iVar24 = od_ec_decode_cdf_q15(poVar50,*paaVar54,2);
          if (r->allow_update_cdf != '\0') {
            uVar34 = pFVar51->single_ref_cdf[iVar23][5][2];
            bVar30 = (char)(uVar34 >> 4) + 4;
            uVar35 = (*paaVar54)[0];
            if ((char)iVar24 < '\x01') {
              sVar20 = -(uVar35 >> (bVar30 & 0x1f));
            }
            else {
              sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
            }
            (*paaVar54)[0] = sVar20 + uVar35;
            pFVar51->single_ref_cdf[iVar23][5][2] = uVar34 + (uVar34 < 0x20);
          }
          ref_frame = '\x06' - (iVar24 == 0);
        }
      }
    }
    else {
      uVar36 = *(ushort *)&pMVar6->field_0xa7 & 7;
      uVar21 = (pbi->common).seg.feature_mask[uVar36];
      if ((uVar21 & 0x20) == 0) {
        ref_frame = '\x01';
        if ((uVar21 & 0xc0) == 0) goto LAB_00182301;
      }
      else {
        ref_frame = *(MV_REFERENCE_FRAME *)
                     ((long)(pbi->common).seg.feature_data[0] + (ulong)(uVar36 << 4) + 10);
      }
    }
    pMVar6->ref_frame[0] = ref_frame;
    pMVar6->ref_frame[1] = -1;
    bVar60 = false;
  }
  else {
    ref_frame = (char)(pbi->common).current_frame.skip_mode_info.ref_frame_idx_0 + '\x01';
    pMVar6->ref_frame[0] = ref_frame;
    bVar30 = (char)(pbi->common).current_frame.skip_mode_info.ref_frame_idx_1 + 1;
    pMVar6->ref_frame[1] = bVar30;
LAB_001823d5:
    if ((char)bVar30 < '\x01') {
      bVar60 = false;
    }
    else {
LAB_001823e6:
      if (('\x04' < ref_frame) || (bVar30 < 5)) {
        lVar38 = 0;
        do {
          if ((ref_frame == (&comp_ref0_lut)[lVar38]) && (bVar30 == (&comp_ref1_lut)[lVar38])) {
            ref_frame = (char)lVar38 + '\x14';
            bVar60 = true;
            goto LAB_00182c3c;
          }
          lVar38 = lVar38 + 1;
        } while (lVar38 != 9);
      }
      ref_frame = ref_frame + bVar30 * '\x04' + -0xd;
      bVar60 = true;
    }
  }
LAB_00182c3c:
  local_238 = pMVar6->ref_frame + 1;
  puVar1 = dcb->ref_mv_count;
  ref_mv_stack = (dcb->xd).ref_mv_stack;
  ref_mv_weight = (dcb->xd).weight;
  av1_find_mv_refs(cm,&dcb->xd,pMVar6,ref_frame,puVar1,ref_mv_stack,ref_mv_weight,ref_mvs,
                   (int_mv *)0x0,inter_mode_ctx);
  uVar34 = *(ushort *)&pMVar6->field_0xa7;
  *(ushort *)&pMVar6->field_0xa7 = uVar34 & 0xffcf;
  PVar31 = '\x11';
  local_1f0 = (nmv_component *)CONCAT71(local_1f0._1_7_,ref_frame);
  xd = &dcb->xd;
  local_1e0 = cm;
  if (((uVar34 & 0x40) != 0) ||
     (((pbi->common).seg.enabled != '\0' &&
      (PVar31 = '\x0f', ((pbi->common).seg.feature_mask[uVar34 & 7] & 0xc0) != 0))))
  goto LAB_00183281;
  cVar15 = pMVar6->ref_frame[0];
  bVar30 = *local_238;
  if ((char)bVar30 < '\x01') {
    puVar28 = (uint16_t *)(inter_mode_ctx + cVar15);
  }
  else {
    if ('\x04' < cVar15 || bVar30 < 5) {
      lVar38 = 0;
      do {
        if (((&comp_ref0_lut)[lVar38] == cVar15) && ((&comp_ref1_lut)[lVar38] == bVar30)) {
          cVar15 = (char)lVar38 + '\x14';
          goto LAB_00182d2f;
        }
        lVar38 = lVar38 + 1;
      } while (lVar38 != 9);
    }
    cVar15 = bVar30 * '\x04' + cVar15 + -0xd;
LAB_00182d2f:
    uVar21 = (ushort)inter_mode_ctx[cVar15] & 7;
    uVar41 = 4;
    if ((ushort)uVar21 < 4) {
      uVar41 = (ulong)uVar21;
    }
    puVar28 = compound_mode_ctx_map[(ushort)inter_mode_ctx[cVar15] >> 5 & 7] + uVar41;
  }
  uVar34 = *puVar28;
  poVar50 = &r->ec;
  if (bVar60 == false) {
    uVar21 = uVar34 & 7;
    paaVar54 = pFVar9->newmv_cdf + uVar21;
    iVar23 = od_ec_decode_cdf_q15(poVar50,*paaVar54,2);
    if (r->allow_update_cdf != '\0') {
      uVar35 = pFVar9->newmv_cdf[uVar21][2];
      bVar30 = (char)(uVar35 >> 4) + 4;
      uVar5 = (*paaVar54)[0];
      if ((char)iVar23 < '\x01') {
        sVar20 = -(uVar5 >> (bVar30 & 0x1f));
      }
      else {
        sVar20 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar30 & 0x1f));
      }
      (*paaVar54)[0] = sVar20 + uVar5;
      pFVar9->newmv_cdf[uVar21][2] = uVar35 + (uVar35 < 0x20);
    }
    if (iVar23 == 0) {
      uVar21 = 0x10;
LAB_00182fc8:
      pMVar6->mode = (PREDICTION_MODE)uVar21;
      goto LAB_00182fe2;
    }
    uVar21 = uVar34 >> 3 & 1;
    paaVar54 = pFVar9->zeromv_cdf + uVar21;
    iVar23 = od_ec_decode_cdf_q15(poVar50,*paaVar54,2);
    if (r->allow_update_cdf != '\0') {
      uVar35 = pFVar9->zeromv_cdf[uVar21][2];
      bVar30 = (char)(uVar35 >> 4) + 4;
      uVar5 = (*paaVar54)[0];
      if ((char)iVar23 < '\x01') {
        sVar20 = -(uVar5 >> (bVar30 & 0x1f));
      }
      else {
        sVar20 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar30 & 0x1f));
      }
      (*paaVar54)[0] = sVar20 + uVar5;
      pFVar9->zeromv_cdf[uVar21][2] = uVar35 + (uVar35 < 0x20);
    }
    if (iVar23 == 0) {
      PVar31 = '\x0f';
    }
    else {
      paaVar54 = pFVar9->refmv_cdf + ((uint)(int)(short)uVar34 >> 4 & 0xf);
      iVar23 = od_ec_decode_cdf_q15(poVar50,*paaVar54,2);
      if (r->allow_update_cdf != '\0') {
        uVar34 = (*paaVar54)[2];
        bVar30 = (char)(uVar34 >> 4) + 4;
        uVar35 = (*paaVar54)[0];
        if ((char)iVar23 < '\x01') {
          sVar20 = -(uVar35 >> (bVar30 & 0x1f));
        }
        else {
          sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
        }
        (*paaVar54)[0] = sVar20 + uVar35;
        (*paaVar54)[2] = uVar34 + (uVar34 < 0x20);
      }
      uVar21 = 0xe;
      if (iVar23 != 0) goto LAB_00182fc8;
      PVar31 = '\r';
    }
LAB_00183281:
    pMVar6->mode = PVar31;
  }
  else {
    icdf = ((dcb->xd).tile_ctx)->inter_compound_mode_cdf + (short)uVar34;
    uVar36 = od_ec_decode_cdf_q15(poVar50,*icdf,8);
    if (r->allow_update_cdf != '\0') {
      uVar34 = (*icdf)[8];
      bVar30 = (char)(uVar34 >> 4) + 5;
      lVar38 = 0;
      do {
        uVar35 = (*icdf)[lVar38];
        if (lVar38 < (char)(byte)uVar36) {
          sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
        }
        else {
          sVar20 = -(uVar35 >> (bVar30 & 0x1f));
        }
        (*icdf)[lVar38] = sVar20 + uVar35;
        lVar38 = lVar38 + 1;
      } while (lVar38 != 7);
      (*icdf)[8] = (*icdf)[8] + (ushort)(uVar34 < 0x20);
    }
    uVar21 = uVar36 + 0x11;
    local_1e8 = (nmv_component *)&pMVar6->mode;
    pMVar6->mode = (PREDICTION_MODE)uVar21;
    if (((((byte)uVar36 < 8) && ((0xb2U >> (uVar36 & 0x1f) & 1) != 0)) || ((uVar36 & 0xff) == 0xff))
       || ((uVar36 & 0xff) == 0xfd)) {
LAB_00182fe2:
      local_1e8 = (nmv_component *)&pMVar6->mode;
      bVar32 = (byte)uVar21;
      bVar30 = *local_238;
      bVar33 = pMVar6->ref_frame[0];
      if ('\0' < (char)bVar30) {
        if (bVar30 < 5 || '\x04' < (char)bVar33) {
          lVar38 = 0;
          do {
            if ((bVar33 == (&comp_ref0_lut)[lVar38]) && (bVar30 == (&comp_ref1_lut)[lVar38])) {
              bVar33 = (char)lVar38 + 0x14;
              goto LAB_00183035;
            }
            lVar38 = lVar38 + 1;
          } while (lVar38 != 9);
        }
        bVar33 = (bVar30 * '\x04' + bVar33) - 0xd;
      }
LAB_00183035:
      pMVar6->field_0xa7 = pMVar6->field_0xa7 & 0xcf;
      if ((uVar21 & 0xff | 8) == 0x18) {
        lVar38 = 0;
        bVar59 = true;
        do {
          bVar56 = bVar59;
          if (lVar38 + 1U < (ulong)puVar1[bVar33]) {
            bVar59 = ref_mv_weight[bVar33][lVar38 + 1] < 0x280;
            uVar41 = (ulong)((uint)bVar59 * 2);
            if (0x27f < ref_mv_weight[bVar33][lVar38]) {
              uVar41 = (ulong)bVar59;
            }
            paaVar54 = pFVar9->drl_cdf + uVar41;
            iVar23 = od_ec_decode_cdf_q15(poVar50,*paaVar54,2);
            if (r->allow_update_cdf != '\0') {
              uVar34 = (*paaVar54)[2];
              bVar30 = (char)(uVar34 >> 4) + 4;
              uVar35 = (*paaVar54)[0];
              if ((char)iVar23 < '\x01') {
                sVar20 = -(uVar35 >> (bVar30 & 0x1f));
              }
              else {
                sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
              }
              (*paaVar54)[0] = sVar20 + uVar35;
              (*paaVar54)[2] = uVar34 + (uVar34 < 0x20);
            }
            *(ushort *)&pMVar6->field_0xa7 =
                 *(ushort *)&pMVar6->field_0xa7 & 0xffcf |
                 (ushort)(((int)lVar38 + iVar23 & 3U) << 4);
            if (iVar23 == 0) goto LAB_00183285;
          }
          lVar38 = 1;
          bVar59 = false;
        } while (bVar56);
        bVar32 = (byte)local_1e8->classes_cdf[0];
      }
      pMVar58 = xd;
      if ((bVar32 < 0x17) && ((0x644000U >> (bVar32 & 0x1f) & 1) != 0)) {
        uVar41 = 1;
        lVar38 = 0x13de;
        do {
          if (lVar38 - 0x13dcU < (ulong)puVar1[bVar33]) {
            bVar59 = *(ushort *)
                      ((long)(pMVar58->plane[0].pre + -2) + lVar38 * 2 + (ulong)bVar33 * 0x10) <
                     0x280;
            uVar37 = (ulong)((uint)bVar59 * 2);
            if (0x27f < *(ushort *)
                         ((long)pMVar58->plane[0].pre + lVar38 * 2 + (ulong)bVar33 * 0x10 + -0x42))
            {
              uVar37 = (ulong)bVar59;
            }
            paaVar54 = pFVar9->drl_cdf + uVar37;
            iVar23 = od_ec_decode_cdf_q15(poVar50,*paaVar54,2);
            if (r->allow_update_cdf != '\0') {
              uVar34 = (*paaVar54)[2];
              bVar30 = (char)(uVar34 >> 4) + 4;
              uVar35 = (*paaVar54)[0];
              if ((char)iVar23 < '\x01') {
                sVar20 = -(uVar35 >> (bVar30 & 0x1f));
              }
              else {
                sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
              }
              (*paaVar54)[0] = sVar20 + uVar35;
              (*paaVar54)[2] = uVar34 + (uVar34 < 0x20);
            }
            *(ushort *)&pMVar6->field_0xa7 =
                 *(ushort *)&pMVar6->field_0xa7 & 0xffcf |
                 ((short)uVar41 + (short)iVar23) * 0x10 + 0x30U & 0x30;
            if ((1 < uVar41) || (iVar23 == 0)) break;
          }
          else if (1 < uVar41) break;
          lVar38 = lVar38 + 1;
          uVar41 = uVar41 + 1;
        } while( true );
      }
    }
  }
LAB_00183285:
  pMVar58 = xd;
  bVar30 = pMVar6->mode;
  if ((byte)(bVar30 - 0x19) < 0xf8 == bVar60) {
    aom_internal_error(xd->error_info,AOM_CODEC_CORRUPT_FRAME,
                       "Prediction mode %d invalid with ref frame %d %d",(ulong)bVar30,
                       (ulong)(uint)(int)pMVar6->ref_frame[0],(ulong)(uint)(int)*local_238);
    bVar30 = pMVar6->mode;
  }
  mv = pMVar6->mv;
  if (bVar60 == false) {
    if (bVar30 == 0xf) {
      local_200 = (undefined1  [8])
                  CONCAT26(nearestmv[1].as_mv.col,
                           CONCAT24(nearestmv[1].as_mv.row,
                                    CONCAT22(nearestmv[0].as_mv.col,nearestmv[0].as_mv.row)));
      BVar16 = (*pMVar58->mi)->bsize;
      bVar33 = (pbi->common).features.cur_frame_force_integer_mv;
      bVar60 = false;
LAB_0018335c:
      iVar25 = gm_get_motion_vector
                         ((pbi->common).global_motion + pMVar6->ref_frame[0],
                          (uint)(pbi->common).features.allow_high_precision_mv,BVar16,
                          pMVar58->mi_col,pMVar58->mi_row,(uint)bVar33);
      pMVar6->mv[0] = iVar25;
    }
    else {
      av1_find_best_ref_mvs
                (uVar22,ref_mvs[pMVar6->ref_frame[0]],nearestmv,nearmv,
                 (uint)(pbi->common).features.cur_frame_force_integer_mv);
      bVar30 = pMVar6->mode;
      uVar34 = *(ushort *)&pMVar6->field_0xa7 >> 4;
      uVar41 = (ulong)(uVar34 & 3);
      if (((uVar34 & 3) != 0) && (bVar30 == 0xe)) {
        MVar40 = ref_mv_stack[pMVar6->ref_frame[0]][uVar41 + 1].this_mv.as_mv;
        nearmv[0].as_mv.row = MVar40.row;
        nearmv[0].as_mv.col = MVar40.col;
      }
      MVar40.col = nearestmv[0].as_mv.col;
      MVar40.row = nearestmv[0].as_mv.row;
      MVar46.col = nearestmv[1].as_mv.col;
      MVar46.row = nearestmv[1].as_mv.row;
      local_200._4_2_ = nearestmv[1]._0_2_;
      local_200._6_2_ = nearestmv[1]._2_2_;
      local_200._0_2_ = nearestmv[0]._0_2_;
      local_200._2_2_ = nearestmv[0]._2_2_;
      MVar45 = MVar40;
      MVar53 = MVar46;
      local_25c = nearestmv[0].as_mv.col;
      if (bVar30 != 0x10) goto LAB_001838ce;
      if (1 < puVar1[(char)local_1f0]) {
        MVar40 = *(MV *)(ref_mv_stack[(char)local_1f0] + uVar41);
        local_200._0_2_ = MVar40.row;
        local_200._2_2_ = MVar40.col;
        local_25c = MVar40.col;
      }
      sVar20 = MVar40.row;
      pFVar51 = pMVar58->tile_ctx;
      bVar33 = (pbi->common).features.cur_frame_force_integer_mv;
      if ((_Bool)bVar33 != false) {
        uVar22 = 0xffffffff;
      }
      bVar60 = false;
LAB_00183b92:
      pnVar2 = &pFVar51->nmvc;
      iVar23 = od_ec_decode_cdf_q15(&r->ec,pnVar2->joints_cdf,4);
      bVar30 = (byte)iVar23;
      if (r->allow_update_cdf != '\0') {
        uVar34 = (pFVar51->nmvc).joints_cdf[4];
        bVar32 = (char)(uVar34 >> 4) + 5;
        lVar38 = 0;
        do {
          uVar35 = pnVar2->joints_cdf[lVar38];
          if (lVar38 < (char)bVar30) {
            sVar18 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar32 & 0x1f));
          }
          else {
            sVar18 = -(uVar35 >> (bVar32 & 0x1f));
          }
          pnVar2->joints_cdf[lVar38] = sVar18 + uVar35;
          lVar38 = lVar38 + 1;
        } while (lVar38 != 3);
        paVar49 = (pFVar51->nmvc).joints_cdf + 4;
        *paVar49 = *paVar49 + (ushort)(uVar34 < 0x20);
      }
      if ((bVar30 & 0xfe) == 2) {
        iVar23 = read_mv_component(r,(pFVar51->nmvc).comps,(uint)(bVar33 ^ 1),
                                   (uint)(0 < (int)uVar22));
        sVar18 = (short)iVar23;
      }
      else {
        sVar18 = 0;
      }
      if ((bVar30 & 0xfd) == 1) {
        iVar23 = read_mv_component(r,(pFVar51->nmvc).comps + 1,(uint)(bVar33 ^ 1),
                                   (uint)(0 < (int)uVar22));
        sVar19 = (short)iVar23;
      }
      else {
        sVar19 = 0;
      }
      pMVar6->mv[0].as_mv.row = sVar18 + sVar20;
      pMVar6->mv[0].as_mv.col = sVar19 + local_25c;
    }
    goto LAB_001840a8;
  }
  if (bVar30 == 0x17) {
    MVar40.col = nearestmv[0].as_mv.col;
    MVar40.row = nearestmv[0].as_mv.row;
    MVar46.col = nearestmv[1].as_mv.col;
    MVar46.row = nearestmv[1].as_mv.row;
    local_200._4_2_ = nearestmv[1]._0_2_;
    local_200._6_2_ = nearestmv[1]._2_2_;
    local_200._0_2_ = nearestmv[0]._0_2_;
    local_200._2_2_ = nearestmv[0]._2_2_;
    uVar41 = (ulong)(*(ushort *)&pMVar6->field_0xa7 >> 4 & 3);
  }
  else {
    uVar41 = (ulong)(*(ushort *)&pMVar6->field_0xa7 >> 4 & 3);
    lVar38 = (long)(char)local_1f0;
    MVar40 = ref_mv_stack[lVar38][0].this_mv.as_mv;
    nearestmv[0].as_mv.row = MVar40.row;
    nearestmv[0].as_mv.col = MVar40.col;
    MVar46 = (dcb->xd).ref_mv_stack[lVar38][0].comp_mv.as_mv;
    nearestmv[1].as_mv.row = MVar46.row;
    nearestmv[1].as_mv.col = MVar46.col;
    MVar45 = ref_mv_stack[lVar38][uVar41 + 1].this_mv.as_mv;
    nearmv[0].as_mv.row = MVar45.row;
    nearmv[0].as_mv.col = MVar45.col;
    MVar53 = ref_mv_stack[lVar38][uVar41 + 1].comp_mv.as_mv;
    nearmv[1].as_mv.row = MVar53.row;
    nearmv[1].as_mv.col = MVar53.col;
    if ((pbi->common).features.cur_frame_force_integer_mv == false) {
      if (uVar22 == 0) {
        if (((uint)MVar40 & 1) != 0) {
          nearestmv[0]._0_2_ =
               nearestmv[0].as_mv.row + (ushort)((short)nearestmv[0]._0_2_ < 1) * 2 + -1;
        }
        if (((uint)MVar40 >> 0x10 & 1) != 0) {
          nearestmv[0]._2_2_ =
               nearestmv[0].as_mv.col + (ushort)((short)nearestmv[0]._2_2_ < 1) * 2 + -1;
        }
        if (((uint)MVar46 & 1) != 0) {
          nearestmv[1]._0_2_ =
               nearestmv[1].as_mv.row + (ushort)((short)nearestmv[1]._0_2_ < 1) * 2 + -1;
        }
        if (((uint)MVar46 >> 0x10 & 1) != 0) {
          nearestmv[1]._2_2_ =
               nearestmv[1].as_mv.col + (ushort)((short)nearestmv[1]._2_2_ < 1) * 2 + -1;
        }
        if (((uint)MVar45 & 1) != 0) {
          nearmv[0]._0_2_ = nearmv[0].as_mv.row + (ushort)((short)nearmv[0]._0_2_ < 1) * 2 + -1;
        }
        if (((uint)MVar45 >> 0x10 & 1) != 0) {
          nearmv[0]._2_2_ = nearmv[0].as_mv.col + (ushort)((short)nearmv[0]._2_2_ < 1) * 2 + -1;
        }
        if (((uint)MVar53 & 1) != 0) {
          nearmv[1]._0_2_ = nearmv[1].as_mv.row + (ushort)((short)nearmv[1]._0_2_ < 1) * 2 + -1;
        }
        if (((uint)MVar53 >> 0x10 & 1) != 0) {
          nearmv[1]._2_2_ = nearmv[1].as_mv.col + (ushort)((short)nearmv[1]._2_2_ < 1) * 2 + -1;
        }
      }
    }
    else {
      MVar52 = (MV)((int)MVar40 + 7);
      if (-1 < (short)nearestmv[0]._0_2_) {
        MVar52 = MVar40;
      }
      uVar34 = nearestmv[0].as_mv.row - (MVar52.row & 0xfff8U);
      if (uVar34 != 0) {
        nearestmv[0]._0_2_ = nearestmv[0].as_mv.row - uVar34;
        uVar35 = -uVar34;
        if (0 < (short)uVar34) {
          uVar35 = uVar34;
        }
        if (4 < uVar35) {
          nearestmv[0]._0_2_ = nearestmv[0]._0_2_ + (ushort)(0 < (short)uVar34) * 0x10 + -8;
        }
      }
      uVar44 = nearestmv[0].as_mv.col + 7;
      if (-1 < (int)MVar40) {
        uVar44 = nearestmv[0].as_mv.col;
      }
      uVar34 = nearestmv[0].as_mv.col - (uVar44 & 0xfff8);
      if (uVar34 != 0) {
        nearestmv[0]._2_2_ = nearestmv[0].as_mv.col - uVar34;
        uVar35 = -uVar34;
        if (0 < (short)uVar34) {
          uVar35 = uVar34;
        }
        if (4 < uVar35) {
          nearestmv[0]._2_2_ = nearestmv[0]._2_2_ + (ushort)(0 < (short)uVar34) * 0x10 + -8;
        }
      }
      MVar40 = (MV)((int)MVar46 + 7);
      if (-1 < (short)nearestmv[1]._0_2_) {
        MVar40 = MVar46;
      }
      uVar34 = nearestmv[1].as_mv.row - (MVar40.row & 0xfff8U);
      if (uVar34 != 0) {
        nearestmv[1]._0_2_ = nearestmv[1].as_mv.row - uVar34;
        uVar35 = -uVar34;
        if (0 < (short)uVar34) {
          uVar35 = uVar34;
        }
        if (4 < uVar35) {
          nearestmv[1]._0_2_ = nearestmv[1]._0_2_ + (ushort)(0 < (short)uVar34) * 0x10 + -8;
        }
      }
      uVar44 = nearestmv[1].as_mv.col + 7;
      if (-1 < (int)MVar46) {
        uVar44 = nearestmv[1].as_mv.col;
      }
      uVar34 = nearestmv[1].as_mv.col - (uVar44 & 0xfff8);
      if (uVar34 != 0) {
        nearestmv[1]._2_2_ = nearestmv[1].as_mv.col - uVar34;
        uVar35 = -uVar34;
        if (0 < (short)uVar34) {
          uVar35 = uVar34;
        }
        if (4 < uVar35) {
          nearestmv[1]._2_2_ = nearestmv[1]._2_2_ + (ushort)(0 < (short)uVar34) * 0x10 + -8;
        }
      }
      MVar40 = (MV)((int)MVar45 + 7);
      if (-1 < (short)nearmv[0]._0_2_) {
        MVar40 = MVar45;
      }
      uVar34 = nearmv[0].as_mv.row - (MVar40.row & 0xfff8U);
      if (uVar34 != 0) {
        nearmv[0]._0_2_ = nearmv[0].as_mv.row - uVar34;
        uVar35 = -uVar34;
        if (0 < (short)uVar34) {
          uVar35 = uVar34;
        }
        if (4 < uVar35) {
          nearmv[0]._0_2_ = nearmv[0]._0_2_ + (ushort)(0 < (short)uVar34) * 0x10 + -8;
        }
      }
      uVar44 = nearmv[0].as_mv.col + 7;
      if (-1 < (int)MVar45) {
        uVar44 = nearmv[0].as_mv.col;
      }
      uVar34 = nearmv[0].as_mv.col - (uVar44 & 0xfff8);
      if (uVar34 != 0) {
        nearmv[0]._2_2_ = nearmv[0].as_mv.col - uVar34;
        uVar35 = -uVar34;
        if (0 < (short)uVar34) {
          uVar35 = uVar34;
        }
        if (4 < uVar35) {
          nearmv[0]._2_2_ = nearmv[0]._2_2_ + (ushort)(0 < (short)uVar34) * 0x10 + -8;
        }
      }
      MVar40 = (MV)((int)MVar53 + 7);
      if (-1 < (short)nearmv[1]._0_2_) {
        MVar40 = MVar53;
      }
      uVar34 = nearmv[1].as_mv.row - (MVar40.row & 0xfff8U);
      if (uVar34 != 0) {
        nearmv[1]._0_2_ = nearmv[1].as_mv.row - uVar34;
        uVar35 = -uVar34;
        if (0 < (short)uVar34) {
          uVar35 = uVar34;
        }
        if (4 < uVar35) {
          nearmv[1]._0_2_ = nearmv[1]._0_2_ + (ushort)(0 < (short)uVar34) * 0x10 + -8;
        }
      }
      uVar44 = nearmv[1].as_mv.col + 7;
      if (-1 < (int)MVar53) {
        uVar44 = nearmv[1].as_mv.col;
      }
      uVar34 = nearmv[1].as_mv.col - (uVar44 & 0xfff8);
      if (uVar34 != 0) {
        nearmv[1]._2_2_ = nearmv[1].as_mv.col - uVar34;
        uVar35 = -uVar34;
        if (0 < (short)uVar34) {
          uVar35 = uVar34;
        }
        if (4 < uVar35) {
          nearmv[1]._2_2_ = nearmv[1]._2_2_ + (ushort)(0 < (short)uVar34) * 0x10 + -8;
        }
      }
    }
    MVar40.col = nearestmv[0].as_mv.col;
    MVar40.row = nearestmv[0].as_mv.row;
    MVar46.col = nearestmv[1].as_mv.col;
    MVar46.row = nearestmv[1].as_mv.row;
    local_200._4_2_ = nearestmv[1]._0_2_;
    local_200._6_2_ = nearestmv[1]._2_2_;
    local_200._0_2_ = nearestmv[0]._0_2_;
    local_200._2_2_ = nearestmv[0]._2_2_;
  }
  uVar34 = (short)uVar41 + (ushort)((byte)(bVar30 - 0x15) < 2);
  MVar45 = MVar40;
  if ((0x1510000UL >> ((ulong)bVar30 & 0x3f) & 1) != 0) {
    MVar45 = *(MV *)(ref_mv_stack[(char)local_1f0] + uVar34);
    local_200._0_2_ = MVar45.row;
    local_200._2_2_ = MVar45.col;
  }
  local_25c = MVar45.col;
  MVar53 = MVar46;
  if ((0x1280000UL >> ((ulong)bVar30 & 0x3f) & 1) != 0) {
    MVar53 = ref_mv_stack[(char)local_1f0][uVar34].comp_mv.as_mv;
    local_200._4_2_ = MVar53.row;
    local_200._6_2_ = MVar53.col;
  }
LAB_001838ce:
  sVar20 = MVar45.row;
  bVar33 = (pbi->common).features.cur_frame_force_integer_mv;
  if ((_Bool)bVar33 != false) {
    uVar22 = 0xffffffff;
  }
  if (0xb < bVar30 - 0xd) {
    uVar22 = 0;
    goto LAB_00184117;
  }
  pFVar51 = pMVar58->tile_ctx;
  BVar16 = (*pMVar58->mi)->bsize;
  switch((uint)bVar30) {
  case 0xd:
    mv->as_mv = MVar40;
    break;
  case 0xe:
    iVar11.as_mv.col = nearmv[0].as_mv.col;
    iVar11.as_mv.row = nearmv[0].as_mv.row;
    *mv = iVar11;
    break;
  case 0xf:
    goto LAB_0018335c;
  case 0x10:
    goto LAB_00183b92;
  case 0x11:
    pMVar6->mv[0].as_mv = MVar40;
    *(MV *)(pMVar6->mv + 1) = MVar46;
    break;
  case 0x12:
    *(ulong *)mv = CONCAT26(nearmv[1].as_mv.col,
                            CONCAT24(nearmv[1].as_mv.row,
                                     CONCAT22(nearmv[0].as_mv.col,nearmv[0].as_mv.row)));
    break;
  case 0x13:
    pnVar2 = &pFVar51->nmvc;
    mv->as_mv = MVar40;
    iVar23 = od_ec_decode_cdf_q15(&r->ec,pnVar2->joints_cdf,4);
    bVar30 = (byte)iVar23;
    if (r->allow_update_cdf != '\0') {
      uVar34 = (pFVar51->nmvc).joints_cdf[4];
      bVar32 = (char)(uVar34 >> 4) + 5;
      lVar38 = 0;
      do {
        uVar35 = pnVar2->joints_cdf[lVar38];
        if (lVar38 < (char)bVar30) {
          sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar32 & 0x1f));
        }
        else {
          sVar20 = -(uVar35 >> (bVar32 & 0x1f));
        }
        pnVar2->joints_cdf[lVar38] = sVar20 + uVar35;
        lVar38 = lVar38 + 1;
      } while (lVar38 != 3);
LAB_00183f28:
      paVar49 = (pFVar51->nmvc).joints_cdf + 4;
      *paVar49 = *paVar49 + (ushort)(uVar34 < 0x20);
    }
    goto LAB_00183f39;
  case 0x14:
    pnVar2 = &pFVar51->nmvc;
    iVar23 = od_ec_decode_cdf_q15(&r->ec,pnVar2->joints_cdf,4);
    bVar30 = (byte)iVar23;
    if (r->allow_update_cdf != '\0') {
      uVar34 = (pFVar51->nmvc).joints_cdf[4];
      bVar32 = (char)(uVar34 >> 4) + 5;
      lVar38 = 0;
      do {
        uVar35 = pnVar2->joints_cdf[lVar38];
        if (lVar38 < (char)bVar30) {
          sVar18 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar32 & 0x1f));
        }
        else {
          sVar18 = -(uVar35 >> (bVar32 & 0x1f));
        }
        pnVar2->joints_cdf[lVar38] = sVar18 + uVar35;
        lVar38 = lVar38 + 1;
      } while (lVar38 != 3);
      paVar49 = (pFVar51->nmvc).joints_cdf + 4;
      *paVar49 = *paVar49 + (ushort)(uVar34 < 0x20);
    }
    if ((bVar30 & 0xfe) == 2) {
      iVar23 = read_mv_component(r,(pFVar51->nmvc).comps,(uint)(bVar33 ^ 1),(uint)(0 < (int)uVar22))
      ;
      sVar18 = (short)iVar23;
    }
    else {
      sVar18 = 0;
    }
    if ((bVar30 & 0xfd) == 1) {
      iVar23 = read_mv_component(r,(pFVar51->nmvc).comps + 1,(uint)(bVar33 ^ 1),
                                 (uint)(0 < (int)uVar22));
      sVar19 = (short)iVar23;
    }
    else {
      sVar19 = 0;
    }
    pMVar6->mv[0].as_mv.row = sVar18 + sVar20;
    pMVar6->mv[0].as_mv.col = sVar19 + local_25c;
    iVar26.as_mv.col = nearestmv[1].as_mv.col;
    iVar26.as_mv.row = nearestmv[1].as_mv.row;
    goto LAB_0018409f;
  case 0x15:
    pnVar2 = &pFVar51->nmvc;
    iVar12.as_mv.col = nearmv[0].as_mv.col;
    iVar12.as_mv.row = nearmv[0].as_mv.row;
    *mv = iVar12;
    iVar23 = od_ec_decode_cdf_q15(&r->ec,pnVar2->joints_cdf,4);
    bVar30 = (byte)iVar23;
    if (r->allow_update_cdf != '\0') {
      uVar34 = (pFVar51->nmvc).joints_cdf[4];
      bVar32 = (char)(uVar34 >> 4) + 5;
      lVar38 = 0;
      do {
        uVar35 = pnVar2->joints_cdf[lVar38];
        if (lVar38 < (char)bVar30) {
          sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar32 & 0x1f));
        }
        else {
          sVar20 = -(uVar35 >> (bVar32 & 0x1f));
        }
        pnVar2->joints_cdf[lVar38] = sVar20 + uVar35;
        lVar38 = lVar38 + 1;
      } while (lVar38 != 3);
      goto LAB_00183f28;
    }
LAB_00183f39:
    if ((bVar30 & 0xfe) == 2) {
      iVar23 = read_mv_component(r,(pFVar51->nmvc).comps,(uint)(bVar33 ^ 1),(uint)(0 < (int)uVar22))
      ;
      sVar20 = (short)iVar23;
    }
    else {
      sVar20 = 0;
    }
    if ((bVar30 & 0xfd) == 1) {
      iVar23 = read_mv_component(r,(pFVar51->nmvc).comps + 1,(uint)(bVar33 ^ 1),
                                 (uint)(0 < (int)uVar22));
      sVar18 = (short)iVar23;
    }
    else {
      sVar18 = 0;
    }
    pMVar6->mv[1].as_mv.row = sVar20 + MVar53.row;
    *(short *)((long)pMVar6->mv + 6) = sVar18 + MVar53.col;
    break;
  case 0x16:
    pnVar2 = &pFVar51->nmvc;
    iVar23 = od_ec_decode_cdf_q15(&r->ec,pnVar2->joints_cdf,4);
    bVar30 = (byte)iVar23;
    if (r->allow_update_cdf != '\0') {
      uVar34 = (pFVar51->nmvc).joints_cdf[4];
      bVar32 = (char)(uVar34 >> 4) + 5;
      lVar38 = 0;
      do {
        uVar35 = pnVar2->joints_cdf[lVar38];
        if (lVar38 < (char)bVar30) {
          sVar18 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar32 & 0x1f));
        }
        else {
          sVar18 = -(uVar35 >> (bVar32 & 0x1f));
        }
        pnVar2->joints_cdf[lVar38] = sVar18 + uVar35;
        lVar38 = lVar38 + 1;
      } while (lVar38 != 3);
      paVar49 = (pFVar51->nmvc).joints_cdf + 4;
      *paVar49 = *paVar49 + (ushort)(uVar34 < 0x20);
    }
    if ((bVar30 & 0xfe) == 2) {
      iVar23 = read_mv_component(r,(pFVar51->nmvc).comps,(uint)(bVar33 ^ 1),(uint)(0 < (int)uVar22))
      ;
      sVar18 = (short)iVar23;
    }
    else {
      sVar18 = 0;
    }
    if ((bVar30 & 0xfd) == 1) {
      iVar23 = read_mv_component(r,(pFVar51->nmvc).comps + 1,(uint)(bVar33 ^ 1),
                                 (uint)(0 < (int)uVar22));
      sVar19 = (short)iVar23;
    }
    else {
      sVar19 = 0;
    }
    pMVar6->mv[0].as_mv.row = sVar18 + sVar20;
    pMVar6->mv[0].as_mv.col = sVar19 + local_25c;
    iVar26.as_mv.col = nearmv[1].as_mv.col;
    iVar26.as_mv.row = nearmv[1].as_mv.row;
LAB_0018409f:
    pMVar6->mv[1] = iVar26;
    break;
  case 0x17:
    iVar25 = gm_get_motion_vector
                       ((pbi->common).global_motion + pMVar6->ref_frame[0],
                        (uint)(pbi->common).features.allow_high_precision_mv,BVar16,pMVar58->mi_col,
                        pMVar58->mi_row,(uint)bVar33);
    pMVar6->mv[0] = iVar25;
    iVar25 = gm_get_motion_vector
                       ((pbi->common).global_motion + *local_238,
                        (uint)(pbi->common).features.allow_high_precision_mv,BVar16,pMVar58->mi_col,
                        pMVar58->mi_row,(uint)(pbi->common).features.cur_frame_force_integer_mv);
    pMVar6->mv[1] = iVar25;
    break;
  case 0x18:
    pnVar2 = &pFVar51->nmvc;
    local_1f0 = (pFVar51->nmvc).comps;
    local_1e8 = (pFVar51->nmvc).comps + 1;
    puVar57 = (undefined8 *)local_200;
    lVar38 = 0;
    bVar59 = true;
    do {
      bVar56 = bVar59;
      iVar23 = od_ec_decode_cdf_q15(&r->ec,pnVar2->joints_cdf,4);
      bVar30 = (byte)iVar23;
      if (r->allow_update_cdf != '\0') {
        uVar34 = (pFVar51->nmvc).joints_cdf[4];
        bVar32 = (char)(uVar34 >> 4) + 5;
        lVar47 = 0;
        do {
          uVar35 = pnVar2->joints_cdf[lVar47];
          if (lVar47 < (char)bVar30) {
            sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar32 & 0x1f));
          }
          else {
            sVar20 = -(uVar35 >> (bVar32 & 0x1f));
          }
          pnVar2->joints_cdf[lVar47] = sVar20 + uVar35;
          lVar47 = lVar47 + 1;
        } while (lVar47 != 3);
        paVar49 = (pFVar51->nmvc).joints_cdf + 4;
        *paVar49 = *paVar49 + (ushort)(uVar34 < 0x20);
      }
      if ((bVar30 & 0xfe) == 2) {
        iVar23 = read_mv_component(r,local_1f0,(uint)(bVar33 ^ 1),(uint)(0 < (int)uVar22));
        sVar20 = (short)iVar23;
      }
      else {
        sVar20 = 0;
      }
      if ((bVar30 & 0xfd) == 1) {
        iVar23 = read_mv_component(r,local_1e8,(uint)(bVar33 ^ 1),(uint)(0 < (int)uVar22));
        sVar18 = (short)iVar23;
      }
      else {
        sVar18 = 0;
      }
      iVar25._0_2_ = sVar20 + (short)*(undefined4 *)puVar57;
      iVar25._2_2_ = sVar18 + (short)((uint)*(undefined4 *)puVar57 >> 0x10);
      mv[lVar38] = iVar25;
      lVar38 = 1;
      puVar57 = (undefined8 *)((long)local_200 + 4);
      pMVar58 = xd;
      bVar59 = false;
    } while (bVar56);
  }
LAB_001840a8:
  uVar22 = 0;
  if (((ushort)((mv->as_mv).row + 0x3fffU) < 0x7fff) &&
     (sVar20 = pMVar6->mv[0].as_mv.col, -0x4000 < sVar20)) {
    uVar22 = (uint)(sVar20 < 0x4000);
  }
  if ((((bVar60 != false) && (uVar21 = 0, bVar60 = uVar22 != 0, uVar22 = uVar21, bVar60)) &&
      ((ushort)(pMVar6->mv[1].as_mv.row + 0x3fffU) < 0x7fff)) &&
     (sVar20 = *(short *)((long)pMVar6->mv + 6), -0x4000 < sVar20)) {
    uVar22 = (uint)(sVar20 < 0x4000);
  }
LAB_00184117:
  aom_merge_corrupted_flag(&pMVar58[1].mi_row,uVar22 ^ 1);
  uVar34 = *(ushort *)&pMVar6->field_0xa7;
  *(ushort *)&pMVar6->field_0xa7 = uVar34 & 0xfbff;
  if ((((((pbi->common).seq_params)->enable_interintra_compound != '\0') && ((uVar34 & 0x40) == 0))
      && ((0xf8 < (byte)(pMVar6->bsize - BLOCK_32X64) &&
          ((0xfb < (byte)(pMVar6->mode - 0x11) && ('\0' < pMVar6->ref_frame[0])))))) &&
     (*local_238 < '\x01')) {
    bVar30 = ""[BVar3];
    paaVar54 = pFVar9->interintra_cdf + bVar30;
    poVar50 = &r->ec;
    iVar23 = od_ec_decode_cdf_q15(poVar50,*paaVar54,2);
    if (r->allow_update_cdf != '\0') {
      uVar34 = (*paaVar54)[2];
      bVar33 = (char)(uVar34 >> 4) + 4;
      uVar35 = (*paaVar54)[0];
      if ((char)iVar23 < '\x01') {
        sVar20 = -(uVar35 >> (bVar33 & 0x1f));
      }
      else {
        sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar33 & 0x1f));
      }
      (*paaVar54)[0] = sVar20 + uVar35;
      (*paaVar54)[2] = uVar34 + (uVar34 < 0x20);
    }
    if (iVar23 != 0) {
      pFVar51 = pMVar58->tile_ctx;
      icdf_03 = pFVar51->interintra_mode_cdf + bVar30;
      iVar23 = od_ec_decode_cdf_q15(poVar50,*icdf_03,4);
      if (r->allow_update_cdf != '\0') {
        uVar34 = pFVar51->interintra_mode_cdf[bVar30][4];
        bVar33 = (char)(uVar34 >> 4) + 5;
        lVar38 = 0;
        do {
          uVar35 = (*icdf_03)[lVar38];
          if (lVar38 < (char)(INTERINTRA_MODE)iVar23) {
            sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar33 & 0x1f));
          }
          else {
            sVar20 = -(uVar35 >> (bVar33 & 0x1f));
          }
          (*icdf_03)[lVar38] = sVar20 + uVar35;
          lVar38 = lVar38 + 1;
        } while (lVar38 != 3);
        paVar49 = pFVar51->interintra_mode_cdf[bVar30] + 4;
        *paVar49 = *paVar49 + (ushort)(uVar34 < 0x20);
      }
      *local_238 = 0;
      pMVar6->interintra_mode = (INTERINTRA_MODE)iVar23;
      pMVar6->angle_delta[0] = '\0';
      pMVar6->angle_delta[1] = '\0';
      (pMVar6->filter_intra_mode_info).use_filter_intra = '\0';
      if (0 < av1_wedge_params_lookup[BVar3].wedge_types) {
        paaVar54 = pFVar9->wedge_interintra_cdf + BVar3;
        uVar22 = od_ec_decode_cdf_q15(poVar50,*paaVar54,2);
        if (r->allow_update_cdf != '\0') {
          uVar34 = pFVar9->wedge_interintra_cdf[BVar3][2];
          bVar30 = (char)(uVar34 >> 4) + 4;
          uVar35 = (*paaVar54)[0];
          if ((char)uVar22 < '\x01') {
            sVar20 = -(uVar35 >> (bVar30 & 0x1f));
          }
          else {
            sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
          }
          (*paaVar54)[0] = sVar20 + uVar35;
          pFVar9->wedge_interintra_cdf[BVar3][2] = uVar34 + (uVar34 < 0x20);
        }
        *(ushort *)&pMVar6->field_0xa7 =
             *(ushort *)&pMVar6->field_0xa7 & 0xfbff | (ushort)((uVar22 & 1) << 10);
        if ((uVar22 & 1) != 0) {
          uVar41 = (ulong)BVar3;
          paVar49 = pFVar9->wedge_idx_cdf[0] + (ulong)BVar3 + uVar41 * 0x10;
          iVar23 = od_ec_decode_cdf_q15(poVar50,paVar49,0x10);
          if (r->allow_update_cdf != '\0') {
            uVar34 = pFVar9->wedge_idx_cdf[0][(ulong)BVar3 + uVar41 * 0x10 + 0x10];
            bVar30 = (char)(uVar34 >> 4) + 5;
            lVar38 = 0;
            do {
              uVar35 = paVar49[lVar38];
              if (lVar38 < (char)iVar23) {
                sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
              }
              else {
                sVar20 = -(uVar35 >> (bVar30 & 0x1f));
              }
              paVar49[lVar38] = sVar20 + uVar35;
              lVar38 = lVar38 + 1;
            } while (lVar38 != 0xf);
            paVar49 = pFVar9->wedge_idx_cdf[0] + (ulong)BVar3 + uVar41 * 0x10 + 0x10;
            *paVar49 = *paVar49 + (ushort)(uVar34 < 0x20);
          }
          pMVar6->interintra_wedge_index = (char)iVar23;
        }
      }
    }
  }
  bVar30 = 1;
  lVar38 = 0;
  do {
    if (((byte)(pMVar6->ref_frame[lVar38] - 1U) < 8) &&
       (iVar23 = (pbi->common).remapped_ref_idx[(byte)pMVar6->ref_frame[lVar38] - 1], iVar23 != -1))
    {
      psVar48 = (pbi->common).ref_scale_factors + iVar23;
    }
    else {
      psVar48 = (scale_factors *)0x0;
    }
    pMVar58->block_ref_scale_factors[lVar38] = psVar48;
    bVar33 = *local_238;
    lVar38 = 1;
    bVar60 = (bool)(bVar30 & '\0' < (char)bVar33);
    bVar30 = 0;
  } while (bVar60);
  pMVar6->motion_mode = '\0';
  bVar30 = block_size_high[pMVar6->bsize];
  if (block_size_wide[pMVar6->bsize] < block_size_high[pMVar6->bsize]) {
    bVar30 = block_size_wide[pMVar6->bsize];
  }
  if (((7 < bVar30) && ((char)bVar33 < '\x01')) && ((*(ushort *)&pMVar6->field_0xa7 & 0x40) == 0)) {
    uVar14 = av1_findSamples(local_1e0,pMVar58,pts,pts_inref);
    pMVar6->num_proj_ref = uVar14;
  }
  av1_count_overlappable_neighbors(local_1e0,pMVar58);
  if (*local_238 == 0) {
    bVar60 = false;
  }
  else {
    if ((((pbi->common).features.switchable_motion_mode == false) ||
        ((pMVar6->field_0xa7 & 0x40) != 0)) || (pMVar6->overlappable_neighbors == '\0')) {
LAB_001843f2:
      MVar17 = '\0';
    }
    else {
      BVar16 = pMVar6->bsize;
      if (pMVar58->cur_frame_force_integer_mv == 0) {
        bVar30 = block_size_high[BVar16];
        if (block_size_wide[BVar16] < block_size_high[BVar16]) {
          bVar30 = block_size_wide[BVar16];
        }
        if (((1 < pMVar58->global_motion[pMVar6->ref_frame[0]].wmtype) &&
            ((pMVar6->mode - 0xf & 0xf7) == 0)) && (7 < bVar30)) goto LAB_001843f2;
      }
      else {
        bVar30 = block_size_high[BVar16];
        if (block_size_wide[BVar16] < block_size_high[BVar16]) {
          bVar30 = block_size_wide[BVar16];
        }
      }
      if (bVar30 < 8) goto LAB_001843f2;
      MVar17 = '\0';
      if ((*local_238 < '\0') && (MVar17 = '\0', 0xf3 < (byte)(pMVar6->mode - 0x19))) {
        if ((pMVar58->cur_frame_force_integer_mv == 0) &&
           (((pbi->common).features.allow_warped_motion != false && (pMVar6->num_proj_ref != '\0')))
           ) {
          iVar23 = pMVar58->block_ref_scale_factors[0]->x_scale_fp;
          if ((iVar23 == -1) ||
             ((iVar24 = pMVar58->block_ref_scale_factors[0]->y_scale_fp, iVar24 == -1 ||
              (iVar24 == 0x4000 && iVar23 == 0x4000)))) {
            pFVar51 = pMVar58->tile_ctx;
            paaVar55 = pFVar51->motion_mode_cdf + BVar16;
            iVar23 = od_ec_decode_cdf_q15(&r->ec,*paaVar55,3);
            MVar17 = (MOTION_MODE)iVar23;
            if (r->allow_update_cdf != '\0') {
              uVar34 = pFVar51->motion_mode_cdf[BVar16][3];
              bVar30 = (char)(uVar34 >> 4) + 4;
              lVar38 = 0;
              do {
                uVar35 = (*paaVar55)[lVar38];
                if (lVar38 < (char)MVar17) {
                  sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
                }
                else {
                  sVar20 = -(uVar35 >> (bVar30 & 0x1f));
                }
                (*paaVar55)[lVar38] = sVar20 + uVar35;
                lVar38 = lVar38 + 1;
              } while (lVar38 != 2);
              paVar49 = pFVar51->motion_mode_cdf[BVar16] + 3;
              *paVar49 = *paVar49 + (ushort)(uVar34 < 0x20);
            }
            goto LAB_001843f4;
          }
        }
        pFVar51 = pMVar58->tile_ctx;
        paaVar54 = pFVar51->obmc_cdf + BVar16;
        iVar23 = od_ec_decode_cdf_q15(&r->ec,*paaVar54,2);
        MVar17 = (MOTION_MODE)iVar23;
        if (r->allow_update_cdf != '\0') {
          uVar34 = pFVar51->obmc_cdf[BVar16][2];
          bVar30 = (char)(uVar34 >> 4) + 4;
          uVar35 = (*paaVar54)[0];
          if ((char)MVar17 < '\x01') {
            sVar20 = -(uVar35 >> (bVar30 & 0x1f));
          }
          else {
            sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
          }
          (*paaVar54)[0] = sVar20 + uVar35;
          pFVar51->obmc_cdf[BVar16][2] = uVar34 + (uVar34 < 0x20);
        }
      }
    }
LAB_001843f4:
    pMVar6->motion_mode = MVar17;
    bVar60 = '\0' < *local_238;
  }
  uVar34 = *(ushort *)&pMVar6->field_0xa7;
  uVar22 = uVar34 & 0xfcff | 0x200;
  uVar35 = (ushort)uVar22;
  *(ushort *)&pMVar6->field_0xa7 = uVar35;
  (pMVar6->interinter_comp).type = '\0';
  if ((bVar60) && ((uVar34 & 0x40) == 0)) {
    bVar30 = block_size_high[BVar3];
    if (block_size_wide[BVar3] < block_size_high[BVar3]) {
      bVar30 = block_size_wide[BVar3];
    }
    pSVar29 = (pbi->common).seq_params;
    if (7 < bVar30) {
      if (pSVar29->enable_masked_compound != '\0') {
        pMVar7 = pMVar58->left_mbmi;
        pMVar8 = pMVar58->above_mbmi;
        uVar21 = 0;
        uVar22 = 0;
        if (pMVar8 != (MB_MODE_INFO *)0x0) {
          if (pMVar8->ref_frame[1] < '\x01') {
            uVar22 = (uint)(pMVar8->ref_frame[0] == '\a') * 3;
          }
          else {
            uVar22 = *(ushort *)&pMVar8->field_0xa7 >> 8 & 1;
          }
        }
        if (pMVar7 != (MB_MODE_INFO *)0x0) {
          if (pMVar7->ref_frame[1] < '\x01') {
            uVar21 = (uint)(pMVar7->ref_frame[0] == '\a') * 3;
          }
          else {
            uVar21 = *(ushort *)&pMVar7->field_0xa7 >> 8 & 1;
          }
        }
        uVar41 = 5;
        if (uVar21 + uVar22 < 5) {
          uVar41 = (ulong)(uVar21 + uVar22);
        }
        paaVar54 = pFVar9->comp_group_idx_cdf + uVar41;
        uVar22 = od_ec_decode_cdf_q15(&r->ec,*paaVar54,2);
        if (r->allow_update_cdf != '\0') {
          uVar34 = (*paaVar54)[2];
          bVar30 = (char)(uVar34 >> 4) + 4;
          uVar35 = (*paaVar54)[0];
          if ((char)uVar22 < '\x01') {
            sVar20 = -(uVar35 >> (bVar30 & 0x1f));
          }
          else {
            sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
          }
          (*paaVar54)[0] = sVar20 + uVar35;
          (*paaVar54)[2] = uVar34 + (uVar34 < 0x20);
        }
        uVar22 = *(ushort *)&pMVar6->field_0xa7 & 0xfffffeff | (uVar22 & 1) << 8;
        *(short *)&pMVar6->field_0xa7 = (short)uVar22;
      }
      if ((uVar22 >> 8 & 1) != 0) {
        if (av1_wedge_params_lookup[BVar3].wedge_types < 1) {
          (pMVar6->interinter_comp).type = '\x03';
        }
        else {
          paaVar54 = pFVar9->compound_type_cdf + BVar3;
          poVar50 = &r->ec;
          iVar23 = od_ec_decode_cdf_q15(poVar50,*paaVar54,2);
          cVar15 = (char)iVar23;
          if (r->allow_update_cdf != '\0') {
            uVar34 = pFVar9->compound_type_cdf[BVar3][2];
            bVar30 = (char)(uVar34 >> 4) + 4;
            uVar35 = (*paaVar54)[0];
            if (cVar15 < '\x01') {
              sVar20 = -(uVar35 >> (bVar30 & 0x1f));
            }
            else {
              sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
            }
            (*paaVar54)[0] = sVar20 + uVar35;
            pFVar9->compound_type_cdf[BVar3][2] = uVar34 + (uVar34 < 0x20);
          }
          (pMVar6->interinter_comp).type = cVar15 + '\x02';
          if (cVar15 == '\0') {
            uVar41 = (ulong)BVar3;
            paVar49 = pFVar9->wedge_idx_cdf[0] + (ulong)BVar3 + uVar41 * 0x10;
            iVar23 = od_ec_decode_cdf_q15(poVar50,paVar49,0x10);
            if (r->allow_update_cdf != '\0') {
              uVar34 = pFVar9->wedge_idx_cdf[0][(ulong)BVar3 + uVar41 * 0x10 + 0x10];
              bVar30 = (char)(uVar34 >> 4) + 5;
              lVar38 = 0;
              do {
                uVar35 = paVar49[lVar38];
                if (lVar38 < (char)iVar23) {
                  sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
                }
                else {
                  sVar20 = -(uVar35 >> (bVar30 & 0x1f));
                }
                paVar49[lVar38] = sVar20 + uVar35;
                lVar38 = lVar38 + 1;
              } while (lVar38 != 0xf);
              paVar49 = pFVar9->wedge_idx_cdf[0] + (ulong)BVar3 + uVar41 * 0x10 + 0x10;
              *paVar49 = *paVar49 + (ushort)(uVar34 < 0x20);
            }
            (pMVar6->interinter_comp).wedge_index = (char)iVar23;
            iVar23 = od_ec_decode_bool_q15(poVar50,0x4000);
            (pMVar6->interinter_comp).wedge_sign = (int8_t)iVar23;
            goto LAB_00184955;
          }
        }
        iVar23 = od_ec_decode_bool_q15(&r->ec,0x4000);
        (pMVar6->interinter_comp).mask_type = (DIFFWTD_MASK_TYPE)iVar23;
        goto LAB_00184955;
      }
      pSVar29 = (pbi->common).seq_params;
      uVar35 = (ushort)uVar22 | 0x200;
    }
    if ((pSVar29->order_hint_info).enable_dist_wtd_comp == 0) {
      *(ushort *)&pMVar6->field_0xa7 = uVar35;
      (pMVar6->interinter_comp).type = '\0';
    }
    else {
      bVar30 = (*pMVar58->mi)->ref_frame[0];
      if (((byte)(bVar30 - 1) < 8) &&
         (lVar38 = (long)(pbi->common).remapped_ref_idx[bVar30 - 1], lVar38 != -1)) {
        pRVar39 = (pbi->common).ref_frame_map[lVar38];
      }
      else {
        pRVar39 = (RefCntBuffer *)0x0;
      }
      bVar30 = (*pMVar58->mi)->ref_frame[1];
      uVar22 = 0;
      if (((byte)(bVar30 - 1) < 8) &&
         (lVar38 = (long)(pbi->common).remapped_ref_idx[bVar30 - 1], lVar38 != -1)) {
        pRVar42 = (pbi->common).ref_frame_map[lVar38];
      }
      else {
        pRVar42 = (RefCntBuffer *)0x0;
      }
      if (pRVar39 != (RefCntBuffer *)0x0) {
        uVar22 = pRVar39->order_hint;
      }
      iVar23 = 0;
      uVar21 = 0;
      if (pRVar42 != (RefCntBuffer *)0x0) {
        uVar21 = pRVar42->order_hint;
      }
      iVar24 = 0;
      if ((pSVar29->order_hint_info).enable_order_hint != 0) {
        uVar36 = ((pbi->common).cur_frame)->order_hint;
        uVar21 = uVar21 - uVar36;
        uVar27 = 1 << ((byte)(pSVar29->order_hint_info).order_hint_bits_minus_1 & 0x1f);
        iVar23 = (uVar27 - 1 & uVar21) - (uVar21 & uVar27);
        uVar36 = uVar36 - uVar22;
        iVar24 = (uVar27 - 1 & uVar36) - (uVar36 & uVar27);
      }
      pMVar7 = pMVar58->left_mbmi;
      pMVar8 = pMVar58->above_mbmi;
      if (pMVar8 == (MB_MODE_INFO *)0x0) {
        uVar41 = 0;
      }
      else if (pMVar8->ref_frame[1] < '\x01') {
        uVar41 = (ulong)(pMVar8->ref_frame[0] == '\a');
      }
      else {
        uVar41 = (ulong)(*(ushort *)&pMVar8->field_0xa7 >> 9 & 1);
      }
      if (pMVar7 == (MB_MODE_INFO *)0x0) {
        uVar37 = 0;
      }
      else if (pMVar7->ref_frame[1] < '\x01') {
        uVar37 = (ulong)(pMVar7->ref_frame[0] == '\a');
      }
      else {
        uVar37 = (ulong)(*(ushort *)&pMVar7->field_0xa7 >> 9 & 1);
      }
      iVar10 = -iVar23;
      if (0 < iVar23) {
        iVar10 = iVar23;
      }
      iVar23 = -iVar24;
      if (0 < iVar24) {
        iVar23 = iVar24;
      }
      lVar38 = uVar41 + uVar37 + (ulong)(iVar10 == iVar23) * 3;
      paaVar54 = pFVar9->compound_index_cdf + lVar38;
      uVar22 = od_ec_decode_cdf_q15(&r->ec,*paaVar54,2);
      if (r->allow_update_cdf != '\0') {
        uVar34 = pFVar9->compound_index_cdf[lVar38][2];
        bVar30 = (char)(uVar34 >> 4) + 4;
        uVar35 = (*paaVar54)[0];
        if ((char)(byte)uVar22 < '\x01') {
          sVar20 = -(uVar35 >> (bVar30 & 0x1f));
        }
        else {
          sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
        }
        (*paaVar54)[0] = sVar20 + uVar35;
        pFVar9->compound_index_cdf[lVar38][2] = uVar34 + (uVar34 < 0x20);
      }
      *(ushort *)&pMVar6->field_0xa7 =
           *(ushort *)&pMVar6->field_0xa7 & 0xfdff | (ushort)((uVar22 & 1) << 9);
      (pMVar6->interinter_comp).type = ~(byte)uVar22 & 1;
    }
  }
LAB_00184955:
  uVar22 = (uint)(pbi->common).features.interp_filter;
  pMVar7 = *pMVar58->mi;
  if (((pMVar7->field_0xa7 & 0x40) == 0) && (pMVar7->motion_mode != '\x02')) {
    uVar14 = ((pbi->common).seq_params)->enable_dual_filter;
    pFVar9 = pMVar58->tile_ctx;
    if ((pMVar7->mode == '\x17') || (pMVar7->mode == '\x0f')) {
      bVar30 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
               [pMVar7->bsize];
      if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [pMVar7->bsize] <
          "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [pMVar7->bsize]) {
        bVar30 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [pMVar7->bsize];
      }
      if (1 < bVar30) {
        bVar30 = 1;
        lVar38 = 0;
        do {
          if (pMVar58->global_motion[pMVar7->ref_frame[lVar38]].wmtype == '\x01') goto LAB_00184ad6;
          bVar33 = ~bVar30;
          lVar38 = 1;
          bVar30 = 0;
        } while (!(bool)(bVar33 & 1 | pMVar7->ref_frame[1] < '\x01'));
        goto LAB_0018497e;
      }
    }
LAB_00184ad6:
    if (uVar22 == 4) {
      iVar23 = 0;
      pbVar43 = &local_241;
      local_241 = 0;
      local_242 = 0;
      bVar60 = true;
      do {
        bVar59 = bVar60;
        iVar23 = av1_get_pred_context_switchable_interp(xd,iVar23);
        paaVar55 = pFVar9->switchable_interp_cdf + iVar23;
        iVar23 = od_ec_decode_cdf_q15(&r->ec,*paaVar55,3);
        if (r->allow_update_cdf != '\0') {
          uVar34 = (*paaVar55)[3];
          bVar30 = (char)(uVar34 >> 4) + 4;
          lVar38 = 0;
          do {
            uVar35 = (*paaVar55)[lVar38];
            if (lVar38 < (char)(byte)iVar23) {
              sVar20 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar30 & 0x1f));
            }
            else {
              sVar20 = -(uVar35 >> (bVar30 & 0x1f));
            }
            (*paaVar55)[lVar38] = sVar20 + uVar35;
            lVar38 = lVar38 + 1;
          } while (lVar38 != 2);
          (*paaVar55)[3] = (*paaVar55)[3] + (ushort)(uVar34 < 0x20);
        }
        *pbVar43 = (byte)iVar23;
        bVar30 = local_241;
        if (uVar14 == '\0') break;
        iVar23 = 1;
        pbVar43 = &local_242;
        bVar60 = false;
        bVar30 = local_242;
      } while (bVar59);
      *(ushort *)((long)&pMVar6->interp_filters + 2) = (ushort)bVar30;
      *(ushort *)&pMVar6->interp_filters = (ushort)local_241;
      pMVar58 = xd;
    }
    else {
      (pMVar6->interp_filters).as_int = uVar22 << 0x10 | uVar22;
    }
  }
  else {
LAB_0018497e:
    uVar21 = 0;
    if (uVar22 != 4) {
      uVar21 = uVar22;
    }
    (pMVar6->interp_filters).as_int = uVar21 << 0x10 | uVar21;
  }
  if (pMVar6->motion_mode == '\x02') {
    iVar23 = pMVar58->mi_row;
    iVar24 = pMVar58->mi_col;
    (pMVar6->wm_params).wmtype = '\x03';
    (pMVar6->wm_params).invalid = '\0';
    bVar30 = pMVar6->num_proj_ref;
    if (1 < bVar30) {
      bVar30 = av1_selectSamples(&mv->as_mv,pts,pts_inref,(uint)bVar30,BVar3);
      pMVar6->num_proj_ref = bVar30;
    }
    iVar23 = av1_find_projection((uint)bVar30,pts,pts_inref,BVar3,(int)pMVar6->mv[0].as_mv.row,
                                 (int)pMVar6->mv[0].as_mv.col,&pMVar6->wm_params,iVar23,iVar24);
    pMVar58 = xd;
    if (iVar23 != 0) {
      (pMVar6->wm_params).invalid = '\x01';
    }
  }
  if (((pbi->common).seq_params)->monochrome == '\0') {
    uVar22 = 1;
    if (pMVar58->is_chroma_ref != true) goto LAB_00184a75;
    pMVar6 = *pMVar58->mi;
    if ((pMVar6->field_0xa7 & 0x80) == 0) {
      uVar22 = 0;
      if (pMVar6->ref_frame[0] < '\x01') {
        uVar22 = (uint)(pMVar6->uv_mode == '\r');
      }
      goto LAB_00184a75;
    }
  }
  uVar22 = 0;
LAB_00184a75:
  (pMVar58->cfl).store_y = uVar22;
  return;
}

Assistant:

static void read_inter_frame_mode_info(AV1Decoder *const pbi,
                                       DecoderCodingBlock *dcb, aom_reader *r) {
  AV1_COMMON *const cm = &pbi->common;
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  int inter_block = 1;

  mbmi->mv[0].as_int = 0;
  mbmi->mv[1].as_int = 0;
  mbmi->segment_id = read_inter_segment_id(cm, xd, 1, r);

  mbmi->skip_mode = read_skip_mode(cm, xd, mbmi->segment_id, r);

  if (mbmi->skip_mode)
    mbmi->skip_txfm = 1;
  else
    mbmi->skip_txfm = read_skip_txfm(cm, xd, mbmi->segment_id, r);

  if (!cm->seg.segid_preskip)
    mbmi->segment_id = read_inter_segment_id(cm, xd, 0, r);

  read_cdef(cm, r, xd);

  read_delta_q_params(cm, xd, r);

  if (!mbmi->skip_mode)
    inter_block = read_is_inter_block(cm, xd, mbmi->segment_id, r);

  mbmi->current_qindex = xd->current_base_qindex;

  xd->above_txfm_context =
      cm->above_contexts.txfm[xd->tile.tile_row] + xd->mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (xd->mi_row & MAX_MIB_MASK);

  if (inter_block)
    read_inter_block_mode_info(pbi, dcb, mbmi, r);
  else
    read_intra_block_mode_info(cm, xd, mbmi, r);
}